

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_core.c
# Opt level: O2

_Bool map_loop(gravity_vm *vm,gravity_value_t *args,uint16_t nargs,uint32_t rindex)

{
  gravity_object_t *closure;
  gravity_object_t *pgVar1;
  _Bool _Var2;
  uint32_t n;
  gravity_fiber_t *fiber;
  gravity_object_t *obj;
  nanotime_t nVar3;
  nanotime_t nVar4;
  long lVar5;
  gravity_value_t value;
  gravity_value_t gVar6;
  char _buffer [4096];
  
  if (nargs < 2) {
    builtin_strncpy(_buffer + 0x10," of arguments.",0xf);
    _buffer[0] = 'I';
    _buffer[1] = 'n';
    _buffer[2] = 'c';
    _buffer[3] = 'o';
    _buffer[4] = 'r';
    _buffer[5] = 'r';
    _buffer[6] = 'e';
    _buffer[7] = 'c';
    _buffer[8] = 't';
    _buffer[9] = ' ';
    _buffer[10] = 'n';
    _buffer[0xb] = 'u';
    _buffer[0xc] = 'm';
    _buffer[0xd] = 'b';
    _buffer[0xe] = 'e';
    _buffer[0xf] = 'r';
  }
  else {
    if (args[1].isa == gravity_class_closure) {
      closure = args[1].field_1.p;
      pgVar1 = (args->field_1).p;
      gVar6 = *args;
      n = gravity_hash_count((gravity_hash_t *)pgVar1->objclass);
      obj = (gravity_object_t *)gravity_list_new((gravity_vm *)0x0,n);
      gravity_hash_iterate((gravity_hash_t *)pgVar1->objclass,map_keys_array,obj);
      nVar3 = nanotime();
      lVar5 = 0;
      do {
        if ((ulong)n * 0x10 + 0x10 == lVar5 + 0x10) {
          nVar4 = nanotime();
          gravity_vm_transfer(vm,obj);
          gVar6.field_1.p = (gravity_object_t *)(nVar4 - nVar3);
          gVar6.isa = gravity_class_int;
          gravity_vm_setslot(vm,gVar6,rindex);
          return true;
        }
        _Var2 = gravity_vm_runclosure
                          (vm,(gravity_closure_t *)closure,gVar6,
                           (gravity_value_t *)(lVar5 + *(long *)&obj->has_outer),1);
        lVar5 = lVar5 + 0x10;
      } while (_Var2);
      return false;
    }
    builtin_strncpy(_buffer + 0x10," a Closure.",0xc);
    _buffer[0] = 'A';
    _buffer[1] = 'r';
    _buffer[2] = 'g';
    _buffer[3] = 'u';
    _buffer[4] = 'm';
    _buffer[5] = 'e';
    _buffer[6] = 'n';
    _buffer[7] = 't';
    _buffer[8] = ' ';
    _buffer[9] = 'm';
    _buffer[10] = 'u';
    _buffer[0xb] = 's';
    _buffer[0xc] = 't';
    _buffer[0xd] = ' ';
    _buffer[0xe] = 'b';
    _buffer[0xf] = 'e';
  }
  fiber = gravity_vm_fiber(vm);
  gravity_fiber_seterror(fiber,_buffer);
  value.field_1.n = 0;
  value.isa = gravity_class_null;
  gravity_vm_setslot(vm,value,rindex);
  return false;
}

Assistant:

static bool map_loop (gravity_vm *vm, gravity_value_t *args, uint16_t nargs, uint32_t rindex) {
    if (nargs < 2) RETURN_ERROR("Incorrect number of arguments.");
    if (!VALUE_ISA_CLOSURE(GET_VALUE(1))) RETURN_ERROR("Argument must be a Closure.");

    gravity_closure_t *closure = VALUE_AS_CLOSURE(GET_VALUE(1));    // closure to execute
    gravity_value_t value = GET_VALUE(0);                            // self parameter
    gravity_map_t *map = VALUE_AS_MAP(GET_VALUE(0));
    register gravity_int_t n = gravity_hash_count(map->hash);        // times to execute the loop
    register gravity_int_t i = 0;

    // build keys array
    // do not transfer newlist to GC because it could be freed during closure execution
    gravity_list_t *list = gravity_list_new(NULL, (uint32_t)n);
    gravity_hash_iterate(map->hash, map_keys_array, (void *)list);

    nanotime_t t1 = nanotime();
    while (i < n) {
        if (!gravity_vm_runclosure(vm, closure, value, &marray_get(list->array, i), 1)) return false;
        ++i;
    }
    nanotime_t t2 = nanotime();
    
    gravity_vm_transfer(vm, (gravity_object_t*) list);
    RETURN_VALUE(VALUE_FROM_INT(t2-t1), rindex);
}